

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O3

void relmon(monst *mon)

{
  monst *pmVar1;
  monst *pmVar2;
  
  if (mon->dlevel->monlist == (monst *)0x0) {
    panic("relmon: no level->monlist available.");
  }
  mon->dlevel->monsters[mon->mx][mon->my] = (monst *)0x0;
  pmVar1 = mon->dlevel->monlist;
  if (pmVar1 == mon) {
    mon->dlevel->monlist = pmVar1->nmon;
  }
  else {
    do {
      pmVar2 = pmVar1;
      if (pmVar2 == (monst *)0x0) {
        panic("relmon: mon not in list.");
      }
      pmVar1 = pmVar2->nmon;
    } while (pmVar2->nmon != mon);
    pmVar2->nmon = mon->nmon;
  }
  return;
}

Assistant:

void relmon(struct monst *mon)
{
	struct monst *mtmp;

	if (mon->dlevel->monlist == NULL)  panic ("relmon: no level->monlist available.");

	mon->dlevel->monsters[mon->mx][mon->my] = NULL;

	if (mon == mon->dlevel->monlist)
	    mon->dlevel->monlist = mon->dlevel->monlist->nmon;
	else {
		for (mtmp = mon->dlevel->monlist; mtmp && mtmp->nmon != mon; mtmp = mtmp->nmon)
		    ;
		if (mtmp)    mtmp->nmon = mon->nmon;
		else	    panic("relmon: mon not in list.");
	}
}